

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ReadID(SQLexer *this)

{
  int iVar1;
  SQLexer *this_00;
  SQInteger SVar2;
  SQLexer *in_RDI;
  bool bVar3;
  SQChar *unaff_retaddr;
  SQLexer *in_stack_00000008;
  SQInteger res;
  char *in_stack_ffffffffffffffc8;
  sqvector<char,_unsigned_int> *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffdc;
  SQLexer *len;
  
  len = in_RDI;
  sqvector<char,_unsigned_int>::resize
            ((sqvector<char,_unsigned_int> *)in_RDI,in_stack_ffffffffffffffdc,
             (char *)in_stack_ffffffffffffffd0);
  do {
    sqvector<char,_unsigned_int>::push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    Next(in_RDI);
    in_RDI->_currentcolumn = in_RDI->_currentcolumn + 1;
    iVar1 = isalnum((uint)in_RDI->_currdata);
    bVar3 = true;
    if (iVar1 == 0) {
      bVar3 = in_RDI->_currdata == '_';
    }
  } while (bVar3);
  sqvector<char,_unsigned_int>::push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (SQLexer *)sqvector<char,_unsigned_int>::operator[](&in_RDI->_longstr,0);
  sqvector<char,_unsigned_int>::size(&in_RDI->_longstr);
  SVar2 = GetIDType(in_stack_00000008,unaff_retaddr,(SQInteger)len);
  if ((SVar2 == 0x102) || (SVar2 == 0x136)) {
    SetStringValue(this_00);
  }
  return SVar2;
}

Assistant:

SQInteger SQLexer::ReadID()
{
    SQInteger res;
    INIT_TEMP_STRING();
    do {
        APPEND_CHAR(CUR_CHAR);
        NEXT();
    } while(isalnum(CUR_CHAR) || CUR_CHAR == _SC('_'));
    TERMINATE_BUFFER();
    res = GetIDType(&_longstr[0],_longstr.size() - 1);
    if(res == TK_IDENTIFIER || res == TK_CONSTRUCTOR) {
        SetStringValue();
    }
    return res;
}